

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

LBBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vlinearBounds(LBBox3fa *__return_storage_ptr__,
               CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
               *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t primID,
               BBox1f *time_range)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  size_t itime;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  float local_130;
  float local_12c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  size_t local_d0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  undefined1 local_b8 [16];
  anon_class_48_6_c0a27d27 local_a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_a8.scale = &local_12c;
  local_a8.r_scale0 = &local_130;
  local_a8.primID = &local_d0;
  fVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.fnumTimeSegments;
  fVar10 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           super_Geometry.time_range.lower;
  fVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range.upper - fVar10;
  fVar9 = (time_range->lower - fVar10) / fVar6;
  fVar6 = (time_range->upper - fVar10) / fVar6;
  fVar10 = fVar1 * fVar9;
  fVar11 = fVar1 * fVar6;
  auVar3 = vroundss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),9);
  auVar8 = vroundss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),10);
  auVar7 = vmaxss_avx(auVar3,ZEXT816(0));
  auVar2 = vminss_avx(auVar8,ZEXT416((uint)fVar1));
  fVar13 = auVar7._0_4_;
  fVar12 = auVar2._0_4_;
  uVar4 = 0xffffffff;
  if (-1 < (int)auVar3._0_4_) {
    uVar4 = (int)auVar3._0_4_;
  }
  iVar5 = (int)fVar1 + 1;
  if ((int)auVar8._0_4_ < (int)fVar1 + 1) {
    iVar5 = (int)auVar8._0_4_;
  }
  local_130 = r_scale0;
  local_12c = scale;
  local_d0 = primID;
  local_a8.ofs = ofs;
  local_a8.space = space;
  local_a8.this = this;
  linearBounds::anon_class_48_6_c0a27d27::operator()
            ((BBox3fa *)&local_108.field_1,&local_a8,(long)(int)fVar13);
  linearBounds::anon_class_48_6_c0a27d27::operator()
            ((BBox3fa *)&local_128.field_1,&local_a8,(long)(int)fVar12);
  if (iVar5 - uVar4 == 1) {
    auVar7 = vmaxss_avx(ZEXT416((uint)(fVar10 - fVar13)),ZEXT816(0) << 0x40);
    auVar2 = vshufps_avx(auVar7,auVar7,0);
    auVar7 = ZEXT416((uint)(1.0 - auVar7._0_4_));
    auVar7 = vshufps_avx(auVar7,auVar7,0);
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] =
         auVar7._0_4_ * local_108.m128[0] + auVar2._0_4_ * local_128.m128[0];
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] =
         auVar7._4_4_ * local_108.m128[1] + auVar2._4_4_ * local_128.m128[1];
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] =
         auVar7._8_4_ * local_108.m128[2] + auVar2._8_4_ * local_128.m128[2];
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] =
         auVar7._12_4_ * local_108.m128[3] + auVar2._12_4_ * local_128.m128[3];
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] =
         auVar2._0_4_ * local_118 + auVar7._0_4_ * local_f8;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] =
         auVar2._4_4_ * fStack_114 + auVar7._4_4_ * fStack_f4;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] =
         auVar2._8_4_ * fStack_110 + auVar7._8_4_ * fStack_f0;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] =
         auVar2._12_4_ * fStack_10c + auVar7._12_4_ * fStack_ec;
    auVar7 = vmaxss_avx(ZEXT416((uint)(fVar12 - fVar11)),ZEXT816(0) << 0x40);
    auVar2 = vshufps_avx(auVar7,auVar7,0);
    auVar7 = ZEXT416((uint)(1.0 - auVar7._0_4_));
    auVar7 = vshufps_avx(auVar7,auVar7,0);
    (__return_storage_ptr__->bounds1).lower.field_0.m128[0] =
         auVar7._0_4_ * local_128.m128[0] + auVar2._0_4_ * local_108.m128[0];
    (__return_storage_ptr__->bounds1).lower.field_0.m128[1] =
         auVar7._4_4_ * local_128.m128[1] + auVar2._4_4_ * local_108.m128[1];
    (__return_storage_ptr__->bounds1).lower.field_0.m128[2] =
         auVar7._8_4_ * local_128.m128[2] + auVar2._8_4_ * local_108.m128[2];
    (__return_storage_ptr__->bounds1).lower.field_0.m128[3] =
         auVar7._12_4_ * local_128.m128[3] + auVar2._12_4_ * local_108.m128[3];
    (__return_storage_ptr__->bounds1).upper.field_0.m128[0] =
         auVar7._0_4_ * local_118 + auVar2._0_4_ * local_f8;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[1] =
         auVar7._4_4_ * fStack_114 + auVar2._4_4_ * fStack_f4;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[2] =
         auVar7._8_4_ * fStack_110 + auVar2._8_4_ * fStack_f0;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[3] =
         auVar7._12_4_ * fStack_10c + auVar2._12_4_ * fStack_ec;
  }
  else {
    linearBounds::anon_class_48_6_c0a27d27::operator()
              ((BBox3fa *)&local_58.field_1,&local_a8,(long)((int)fVar13 + 1));
    linearBounds::anon_class_48_6_c0a27d27::operator()
              ((BBox3fa *)&local_78.field_1,&local_a8,(long)((int)fVar12 + -1));
    auVar7 = vmaxss_avx(ZEXT416((uint)(fVar10 - fVar13)),ZEXT816(0) << 0x40);
    auVar2 = vshufps_avx(auVar7,auVar7,0);
    auVar7 = ZEXT416((uint)(1.0 - auVar7._0_4_));
    auVar7 = vshufps_avx(auVar7,auVar7,0);
    fVar14 = auVar2._0_4_ * local_58.m128[0] + auVar7._0_4_ * local_108.m128[0];
    fVar15 = auVar2._4_4_ * local_58.m128[1] + auVar7._4_4_ * local_108.m128[1];
    fVar16 = auVar2._8_4_ * local_58.m128[2] + auVar7._8_4_ * local_108.m128[2];
    fVar17 = auVar2._12_4_ * local_58.m128[3] + auVar7._12_4_ * local_108.m128[3];
    fVar18 = auVar2._0_4_ * local_48 + auVar7._0_4_ * local_f8;
    fVar19 = auVar2._4_4_ * fStack_44 + auVar7._4_4_ * fStack_f4;
    fVar20 = auVar2._8_4_ * fStack_40 + auVar7._8_4_ * fStack_f0;
    fVar21 = auVar2._12_4_ * fStack_3c + auVar7._12_4_ * fStack_ec;
    auVar7 = vmaxss_avx(ZEXT416((uint)(fVar12 - fVar11)),ZEXT816(0) << 0x40);
    auVar2 = vshufps_avx(auVar7,auVar7,0);
    auVar7 = ZEXT416((uint)(1.0 - auVar7._0_4_));
    auVar7 = vshufps_avx(auVar7,auVar7,0);
    fVar10 = auVar2._0_4_ * local_78.m128[0] + auVar7._0_4_ * local_128.m128[0];
    fVar11 = auVar2._4_4_ * local_78.m128[1] + auVar7._4_4_ * local_128.m128[1];
    fVar12 = auVar2._8_4_ * local_78.m128[2] + auVar7._8_4_ * local_128.m128[2];
    fVar13 = auVar2._12_4_ * local_78.m128[3] + auVar7._12_4_ * local_128.m128[3];
    fVar22 = auVar2._0_4_ * local_68 + auVar7._0_4_ * local_118;
    fVar23 = auVar2._4_4_ * fStack_64 + auVar7._4_4_ * fStack_114;
    fVar24 = auVar2._8_4_ * fStack_60 + auVar7._8_4_ * fStack_110;
    fVar25 = auVar2._12_4_ * fStack_5c + auVar7._12_4_ * fStack_10c;
    if ((int)(uVar4 + 1) < iVar5) {
      itime = (size_t)(uVar4 + 1);
      iVar5 = ~uVar4 + iVar5;
      do {
        auVar8._0_4_ = ((float)(int)itime / fVar1 - fVar9) / (fVar6 - fVar9);
        auVar8._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar7 = vshufps_avx(auVar8,auVar8,0);
        auVar2 = vshufps_avx(ZEXT416((uint)(1.0 - auVar8._0_4_)),ZEXT416((uint)(1.0 - auVar8._0_4_))
                             ,0);
        local_e8 = fVar22 * auVar7._0_4_ + fVar18 * auVar2._0_4_;
        fStack_e4 = fVar23 * auVar7._4_4_ + fVar19 * auVar2._4_4_;
        fStack_e0 = fVar24 * auVar7._8_4_ + fVar20 * auVar2._8_4_;
        fStack_dc = fVar25 * auVar7._12_4_ + fVar21 * auVar2._12_4_;
        linearBounds::anon_class_48_6_c0a27d27::operator()
                  ((BBox3fa *)&local_c8.field_1,&local_a8,itime);
        auVar3._4_4_ = auVar7._4_4_ * fVar11 + fVar15 * auVar2._4_4_;
        auVar3._0_4_ = auVar7._0_4_ * fVar10 + fVar14 * auVar2._0_4_;
        auVar3._8_4_ = auVar7._8_4_ * fVar12 + fVar16 * auVar2._8_4_;
        auVar3._12_4_ = auVar7._12_4_ * fVar13 + fVar17 * auVar2._12_4_;
        auVar7 = vsubps_avx((undefined1  [16])local_c8,auVar3);
        auVar2._4_4_ = fStack_e4;
        auVar2._0_4_ = local_e8;
        auVar2._8_4_ = fStack_e0;
        auVar2._12_4_ = fStack_dc;
        auVar3 = vsubps_avx(local_b8,auVar2);
        auVar2 = vminps_avx(auVar7,ZEXT816(0) << 0x40);
        auVar7 = vmaxps_avx(auVar3,ZEXT816(0) << 0x40);
        fVar14 = fVar14 + auVar2._0_4_;
        fVar15 = fVar15 + auVar2._4_4_;
        fVar16 = fVar16 + auVar2._8_4_;
        fVar17 = fVar17 + auVar2._12_4_;
        fVar10 = fVar10 + auVar2._0_4_;
        fVar11 = fVar11 + auVar2._4_4_;
        fVar12 = fVar12 + auVar2._8_4_;
        fVar13 = fVar13 + auVar2._12_4_;
        fVar18 = fVar18 + auVar7._0_4_;
        fVar19 = fVar19 + auVar7._4_4_;
        fVar20 = fVar20 + auVar7._8_4_;
        fVar21 = fVar21 + auVar7._12_4_;
        fVar22 = fVar22 + auVar7._0_4_;
        fVar23 = fVar23 + auVar7._4_4_;
        fVar24 = fVar24 + auVar7._8_4_;
        fVar25 = fVar25 + auVar7._12_4_;
        itime = itime + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar14;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar15;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar16;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar17;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar18;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar19;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar20;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar21;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[0] = fVar10;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[1] = fVar11;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[2] = fVar12;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[3] = fVar13;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[0] = fVar22;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[1] = fVar23;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[2] = fVar24;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[3] = fVar25;
  }
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t primID, const BBox1f& time_range) const {
        return linearBounds(ofs,scale,r_scale0,space,primID,time_range);
      }